

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDVertex::GetBoundaryVertexEdgeIndices(ON_SubDVertex *this,uint *vei0,uint *vei1)

{
  ON_SubDEdge *pOVar1;
  ON_SubDEdge *e;
  uint uStack_28;
  unsigned_short vei;
  uint vbi [2];
  uint vbi_count;
  uint *vei1_local;
  uint *vei0_local;
  ON_SubDVertex *this_local;
  
  vbi[0] = 0;
  unique0x100000be = vei1;
  memset((void *)((long)&e + 4),0,8);
  e._2_2_ = 0;
  do {
    if (this->m_edge_count <= e._2_2_) {
LAB_0086db5e:
      if (vbi[0] != 2) {
        uStack_28 = 0xffffffff;
        e._4_4_ = 0xffffffff;
      }
      if (vei0 != (uint *)0x0) {
        *vei0 = e._4_4_;
      }
      if (stack0xffffffffffffffe0 != (uint *)0x0) {
        *stack0xffffffffffffffe0 = uStack_28;
      }
      return vbi[0] == 2;
    }
    pOVar1 = ON_SubDEdgePtr::Edge(this->m_edges + e._2_2_);
    if (pOVar1->m_face_count == 1) {
      if (1 < vbi[0]) {
        vbi[0] = 0;
        goto LAB_0086db5e;
      }
      *(uint *)((long)&e + (ulong)vbi[0] * 4 + 4) = (uint)e._2_2_;
      vbi[0] = vbi[0] + 1;
    }
    e._2_2_ = e._2_2_ + 1;
  } while( true );
}

Assistant:

bool ON_SubDVertex::GetBoundaryVertexEdgeIndices(
  unsigned* vei0,
  unsigned* vei1
) const
{
  unsigned int vbi_count = 0;
  unsigned int vbi[2] = {};
  for (unsigned short vei = 0; vei < m_edge_count; vei++)
  {
    const ON_SubDEdge* e = m_edges[vei].Edge();
    if (1 == e->m_face_count)
    {
      if (vbi_count < 2)
        vbi[vbi_count++] = vei;
      else
      {
        vbi_count = 0;
        break;
      }
    }
  }
  if (2 != vbi_count)
    vbi[0] = vbi[1] = ON_UNSET_UINT_INDEX;
  if (nullptr != vei0)
    *vei0 = vbi[0];
  if (nullptr != vei1)
    *vei1 = vbi[1];
  return (2 == vbi_count);
}